

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O1

uint8_t * __thiscall
ot::commissioner::cose::Sign1Message::GetPayload(Sign1Message *this,size_t *aLength)

{
  uint8_t *puVar1;
  cn_cbor *pcVar2;
  long lVar3;
  
  if ((HCOSE)this->mSign == (HCOSE)0x0) {
    abort();
  }
  pcVar2 = COSE_get_cbor((HCOSE)this->mSign);
  if ((pcVar2 != (cn_cbor *)0x0) && (pcVar2->type == CN_CBOR_ARRAY)) {
    if ((uint)pcVar2->length < 2) {
      pcVar2 = (cn_cbor *)0x0;
    }
    else {
      pcVar2 = pcVar2->first_child;
      lVar3 = 1;
      do {
        pcVar2 = pcVar2->next;
        lVar3 = lVar3 + -1;
      } while (lVar3 == 0);
    }
    if ((pcVar2 != (cn_cbor *)0x0) && (pcVar2->type == CN_CBOR_BYTES)) {
      puVar1 = (pcVar2->v).bytes;
      *aLength = (long)pcVar2->length;
      return puVar1;
    }
  }
  return (uint8_t *)0x0;
}

Assistant:

const uint8_t *Sign1Message::GetPayload(size_t &aLength)
{
    const uint8_t *ret = nullptr;
    cn_cbor       *cbor;
    cn_cbor       *payload;

    VerifyOrDie(mSign != nullptr);
    VerifyOrExit((cbor = COSE_get_cbor(reinterpret_cast<HCOSE>(mSign))) != nullptr);

    VerifyOrExit(cbor->type == CN_CBOR_ARRAY && (payload = CborArrayAt(cbor, 2)) != nullptr);

    VerifyOrExit(payload->type == CN_CBOR_BYTES);

    ret     = payload->v.bytes;
    aLength = payload->length;

exit:
    return ret;
}